

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O2

DdNode * Cudd_bddPickOneMinterm(DdManager *dd,DdNode *f,DdNode **vars,int n)

{
  int *piVar1;
  int iVar2;
  char *string;
  char *__ptr;
  ulong uVar3;
  ulong uVar4;
  DdNode *f_00;
  DdNode *pDVar5;
  ulong uVar6;
  
  string = (char *)malloc((long)dd->size);
  if (string == (char *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
  }
  else {
    __ptr = (char *)malloc((long)n << 2);
    if (__ptr == (char *)0x0) {
      dd->errorCode = CUDD_MEMORY_OUT;
    }
    else {
      uVar3 = 0;
      uVar6 = 0;
      if (0 < n) {
        uVar6 = (ulong)(uint)n;
      }
      for (; uVar6 != uVar3; uVar3 = uVar3 + 1) {
        *(DdHalfWord *)(__ptr + uVar3 * 4) = vars[uVar3]->index;
      }
      iVar2 = Cudd_bddPickOneCube(dd,f,string);
      if (iVar2 != 0) {
        for (uVar3 = 0; uVar6 != uVar3; uVar3 = uVar3 + 1) {
          iVar2 = *(int *)(__ptr + uVar3 * 4);
          if (string[iVar2] == '\x02') {
            uVar4 = Cudd_Random();
            string[iVar2] = (byte)(uVar4 >> 5) & 1;
          }
        }
        f_00 = Cudd_ReadOne(dd);
        piVar1 = (int *)(((ulong)f_00 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        uVar3 = (ulong)(uint)n;
        while( true ) {
          if ((int)uVar3 < 1) {
            piVar1 = (int *)(((ulong)f_00 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + -1;
            free(string);
            free(__ptr);
            return f_00;
          }
          pDVar5 = Cudd_bddAnd(dd,f_00,(DdNode *)
                                       ((ulong)(string[*(int *)(__ptr + uVar3 * 4 + -4)] == '\0') ^
                                       (ulong)vars[uVar3 - 1]));
          if (pDVar5 == (DdNode *)0x0) break;
          piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          Cudd_RecursiveDeref(dd,f_00);
          uVar3 = uVar3 - 1;
          f_00 = pDVar5;
        }
        free(string);
        free(__ptr);
        Cudd_RecursiveDeref(dd,f_00);
        return (DdNode *)0x0;
      }
      free(string);
      string = __ptr;
    }
    free(string);
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
Cudd_bddPickOneMinterm(
  DdManager * dd /* manager */,
  DdNode * f /* function from which to pick one minterm */,
  DdNode ** vars /* array of variables */,
  int  n /* size of <code>vars</code> */)
{
    char *string;
    int i, size;
    int *indices;
    int result;
    DdNode *old, *neW;

    size = dd->size;
    string = ABC_ALLOC(char, size);
    if (string == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    indices = ABC_ALLOC(int,n);
    if (indices == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(string);
        return(NULL);
    }

    for (i = 0; i < n; i++) {
        indices[i] = vars[i]->index;
    }

    result = Cudd_bddPickOneCube(dd,f,string);
    if (result == 0) {
        ABC_FREE(string);
        ABC_FREE(indices);
        return(NULL);
    }

    /* Randomize choice for don't cares. */
    for (i = 0; i < n; i++) {
        if (string[indices[i]] == 2)
            string[indices[i]] = (char) ((Cudd_Random() & 0x20) >> 5);
    }

    /* Build result BDD. */
    old = Cudd_ReadOne(dd);
    cuddRef(old);

    for (i = n-1; i >= 0; i--) {
        neW = Cudd_bddAnd(dd,old,Cudd_NotCond(vars[i],string[indices[i]]==0));
        if (neW == NULL) {
            ABC_FREE(string);
            ABC_FREE(indices);
            Cudd_RecursiveDeref(dd,old);
            return(NULL);
        }
        cuddRef(neW);
        Cudd_RecursiveDeref(dd,old);
        old = neW;
    }

#ifdef DD_DEBUG
    /* Test. */
    if (Cudd_bddLeq(dd,old,f)) {
        cuddDeref(old);
    } else {
        Cudd_RecursiveDeref(dd,old);
        old = NULL;
    }
#else
    cuddDeref(old);
#endif

    ABC_FREE(string);
    ABC_FREE(indices);
    return(old);

}